

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_storage.cpp
# Opt level: O1

void duckdb::VectorOperations::WriteToStorage(Vector *source,idx_t count,data_ptr_t target)

{
  PhysicalType PVar1;
  sel_t *psVar2;
  NotImplementedException *this;
  char *result_data;
  data_t dVar3;
  undefined2 uVar4;
  idx_t iVar5;
  idx_t iVar6;
  undefined8 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  UnifiedVectorFormat vdata;
  UnifiedVectorFormat local_90;
  string local_48;
  
  if (count != 0) {
    UnifiedVectorFormat::UnifiedVectorFormat(&local_90);
    Vector::ToUnifiedFormat(source,count,&local_90);
    PVar1 = (source->type).physical_type_;
    switch(PVar1) {
    case BOOL:
    case INT8:
      iVar6 = 0;
      do {
        iVar5 = iVar6;
        if ((local_90.sel)->sel_vector != (sel_t *)0x0) {
          iVar5 = (idx_t)(local_90.sel)->sel_vector[iVar6];
        }
        if ((local_90.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
             (unsigned_long *)0x0) ||
           ((local_90.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[iVar5 >> 6]
             >> (iVar5 & 0x3f) & 1) != 0)) {
          dVar3 = local_90.data[iVar5];
        }
        else {
          dVar3 = 0x80;
        }
        target[iVar6] = dVar3;
        iVar6 = iVar6 + 1;
      } while (count != iVar6);
      break;
    case UINT8:
      iVar6 = 0;
      do {
        iVar5 = iVar6;
        if ((local_90.sel)->sel_vector != (sel_t *)0x0) {
          iVar5 = (idx_t)(local_90.sel)->sel_vector[iVar6];
        }
        if ((local_90.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
             (unsigned_long *)0x0) ||
           ((local_90.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[iVar5 >> 6]
             >> (iVar5 & 0x3f) & 1) != 0)) {
          dVar3 = local_90.data[iVar5];
        }
        else {
          dVar3 = '\0';
        }
        target[iVar6] = dVar3;
        iVar6 = iVar6 + 1;
      } while (count != iVar6);
      break;
    case UINT16:
      psVar2 = (local_90.sel)->sel_vector;
      iVar6 = 0;
      do {
        iVar5 = iVar6;
        if (psVar2 != (sel_t *)0x0) {
          iVar5 = (idx_t)psVar2[iVar6];
        }
        if ((local_90.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
             (unsigned_long *)0x0) ||
           ((local_90.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[iVar5 >> 6]
             >> (iVar5 & 0x3f) & 1) != 0)) {
          uVar4 = *(undefined2 *)(local_90.data + iVar5 * 2);
        }
        else {
          uVar4 = 0;
        }
        *(undefined2 *)(target + iVar6 * 2) = uVar4;
        iVar6 = iVar6 + 1;
      } while (count != iVar6);
      break;
    case INT16:
      psVar2 = (local_90.sel)->sel_vector;
      iVar6 = 0;
      do {
        iVar5 = iVar6;
        if (psVar2 != (sel_t *)0x0) {
          iVar5 = (idx_t)psVar2[iVar6];
        }
        if ((local_90.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
             (unsigned_long *)0x0) ||
           ((local_90.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[iVar5 >> 6]
             >> (iVar5 & 0x3f) & 1) != 0)) {
          uVar4 = *(undefined2 *)(local_90.data + iVar5 * 2);
        }
        else {
          uVar4 = 0x8000;
        }
        *(undefined2 *)(target + iVar6 * 2) = uVar4;
        iVar6 = iVar6 + 1;
      } while (count != iVar6);
      break;
    case UINT32:
      psVar2 = (local_90.sel)->sel_vector;
      iVar6 = 0;
      do {
        iVar5 = iVar6;
        if (psVar2 != (sel_t *)0x0) {
          iVar5 = (idx_t)psVar2[iVar6];
        }
        if ((local_90.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
             (unsigned_long *)0x0) ||
           ((local_90.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[iVar5 >> 6]
             >> (iVar5 & 0x3f) & 1) != 0)) {
          uVar8 = *(undefined4 *)(local_90.data + iVar5 * 4);
        }
        else {
          uVar8 = 0;
        }
        *(undefined4 *)(target + iVar6 * 4) = uVar8;
        iVar6 = iVar6 + 1;
      } while (count != iVar6);
      break;
    case INT32:
      psVar2 = (local_90.sel)->sel_vector;
      iVar6 = 0;
      do {
        iVar5 = iVar6;
        if (psVar2 != (sel_t *)0x0) {
          iVar5 = (idx_t)psVar2[iVar6];
        }
        if ((local_90.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
             (unsigned_long *)0x0) ||
           ((local_90.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[iVar5 >> 6]
             >> (iVar5 & 0x3f) & 1) != 0)) {
          uVar8 = *(undefined4 *)(local_90.data + iVar5 * 4);
        }
        else {
          uVar8 = 0x80000000;
        }
        *(undefined4 *)(target + iVar6 * 4) = uVar8;
        iVar6 = iVar6 + 1;
      } while (count != iVar6);
      break;
    case UINT64:
      psVar2 = (local_90.sel)->sel_vector;
      iVar6 = 0;
      do {
        iVar5 = iVar6;
        if (psVar2 != (sel_t *)0x0) {
          iVar5 = (idx_t)psVar2[iVar6];
        }
        if ((local_90.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
             (unsigned_long *)0x0) ||
           ((local_90.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[iVar5 >> 6]
             >> (iVar5 & 0x3f) & 1) != 0)) {
          uVar7 = *(undefined8 *)(local_90.data + iVar5 * 8);
        }
        else {
          uVar7 = 0;
        }
        *(undefined8 *)(target + iVar6 * 8) = uVar7;
        iVar6 = iVar6 + 1;
      } while (count != iVar6);
      break;
    case INT64:
      psVar2 = (local_90.sel)->sel_vector;
      iVar6 = 0;
      do {
        iVar5 = iVar6;
        if (psVar2 != (sel_t *)0x0) {
          iVar5 = (idx_t)psVar2[iVar6];
        }
        if ((local_90.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
             (unsigned_long *)0x0) ||
           (uVar7 = 0x8000000000000000,
           (local_90.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[iVar5 >> 6]
            >> (iVar5 & 0x3f) & 1) != 0)) {
          uVar7 = *(undefined8 *)(local_90.data + iVar5 * 8);
        }
        *(undefined8 *)(target + iVar6 * 8) = uVar7;
        iVar6 = iVar6 + 1;
      } while (count != iVar6);
      break;
    case UINT64|UINT8:
    case DOUBLE|BOOL:
    case DOUBLE|UINT8:
    case DOUBLE|INT8:
    case 0x10:
    case 0x11:
    case 0x12:
    case 0x13:
    case 0x14:
switchD_00e5dea0_caseD_a:
      this = (NotImplementedException *)__cxa_allocate_exception(0x10);
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_48,"Unimplemented type for WriteToStorage","");
      NotImplementedException::NotImplementedException(this,&local_48);
      __cxa_throw(this,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
    case FLOAT:
      psVar2 = (local_90.sel)->sel_vector;
      iVar6 = 0;
      do {
        iVar5 = iVar6;
        if (psVar2 != (sel_t *)0x0) {
          iVar5 = (idx_t)psVar2[iVar6];
        }
        if ((local_90.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
             (unsigned_long *)0x0) ||
           (uVar8 = 0x7fc00000,
           (local_90.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[iVar5 >> 6]
            >> (iVar5 & 0x3f) & 1) != 0)) {
          uVar8 = *(undefined4 *)(local_90.data + iVar5 * 4);
        }
        *(undefined4 *)(target + iVar6 * 4) = uVar8;
        iVar6 = iVar6 + 1;
      } while (count != iVar6);
      break;
    case DOUBLE:
      psVar2 = (local_90.sel)->sel_vector;
      iVar6 = 0;
      do {
        iVar5 = iVar6;
        if (psVar2 != (sel_t *)0x0) {
          iVar5 = (idx_t)psVar2[iVar6];
        }
        if ((local_90.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
             (unsigned_long *)0x0) ||
           (uVar8 = 0, uVar9 = 0x7ff80000,
           (local_90.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[iVar5 >> 6]
            >> (iVar5 & 0x3f) & 1) != 0)) {
          uVar8 = (undefined4)*(undefined8 *)(local_90.data + iVar5 * 8);
          uVar9 = (undefined4)((ulong)*(undefined8 *)(local_90.data + iVar5 * 8) >> 0x20);
        }
        *(ulong *)(target + iVar6 * 8) = CONCAT44(uVar9,uVar8);
        iVar6 = iVar6 + 1;
      } while (count != iVar6);
      break;
    case INTERVAL:
      iVar6 = 0;
      do {
        iVar5 = iVar6;
        if ((local_90.sel)->sel_vector != (sel_t *)0x0) {
          iVar5 = (idx_t)(local_90.sel)->sel_vector[iVar6];
        }
        if ((local_90.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
             (unsigned_long *)0x0) ||
           ((local_90.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[iVar5 >> 6]
             >> (iVar5 & 0x3f) & 1) != 0)) {
          uVar7 = *(undefined8 *)(local_90.data + iVar5 * 0x10 + 8);
          *(undefined8 *)target = *(undefined8 *)(local_90.data + iVar5 * 0x10);
          *(undefined8 *)(target + 8) = uVar7;
        }
        else {
          target[0] = '\0';
          target[1] = '\0';
          target[2] = '\0';
          target[3] = 0x80;
          target[4] = '\0';
          target[5] = '\0';
          target[6] = '\0';
          target[7] = 0x80;
          target[8] = '\0';
          target[9] = '\0';
          target[10] = '\0';
          target[0xb] = '\0';
          target[0xc] = '\0';
          target[0xd] = '\0';
          target[0xe] = '\0';
          target[0xf] = 0x80;
        }
        iVar6 = iVar6 + 1;
        target = target + 0x10;
      } while (count != iVar6);
      break;
    default:
      if (PVar1 == UINT128) {
        iVar6 = 0;
        do {
          iVar5 = iVar6;
          if ((local_90.sel)->sel_vector != (sel_t *)0x0) {
            iVar5 = (idx_t)(local_90.sel)->sel_vector[iVar6];
          }
          if ((local_90.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
               (unsigned_long *)0x0) ||
             ((local_90.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
               [iVar5 >> 6] >> (iVar5 & 0x3f) & 1) != 0)) {
            uVar7 = *(undefined8 *)(local_90.data + iVar5 * 0x10 + 8);
            *(undefined8 *)target = *(undefined8 *)(local_90.data + iVar5 * 0x10);
            *(undefined8 *)(target + 8) = uVar7;
          }
          else {
            target[0] = '\0';
            target[1] = '\0';
            target[2] = '\0';
            target[3] = '\0';
            target[4] = '\0';
            target[5] = '\0';
            target[6] = '\0';
            target[7] = '\0';
            target[8] = '\0';
            target[9] = '\0';
            target[10] = '\0';
            target[0xb] = '\0';
            target[0xc] = '\0';
            target[0xd] = '\0';
            target[0xe] = '\0';
            target[0xf] = '\0';
          }
          iVar6 = iVar6 + 1;
          target = target + 0x10;
        } while (count != iVar6);
      }
      else {
        if (PVar1 != INT128) goto switchD_00e5dea0_caseD_a;
        iVar6 = 0;
        do {
          iVar5 = iVar6;
          if ((local_90.sel)->sel_vector != (sel_t *)0x0) {
            iVar5 = (idx_t)(local_90.sel)->sel_vector[iVar6];
          }
          if ((local_90.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
               (unsigned_long *)0x0) ||
             ((local_90.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
               [iVar5 >> 6] >> (iVar5 & 0x3f) & 1) != 0)) {
            uVar7 = *(undefined8 *)(local_90.data + iVar5 * 0x10 + 8);
            *(undefined8 *)target = *(undefined8 *)(local_90.data + iVar5 * 0x10);
            *(undefined8 *)(target + 8) = uVar7;
          }
          else {
            target[0] = '\0';
            target[1] = '\0';
            target[2] = '\0';
            target[3] = '\0';
            target[4] = '\0';
            target[5] = '\0';
            target[6] = '\0';
            target[7] = '\0';
            target[8] = '\0';
            target[9] = '\0';
            target[10] = '\0';
            target[0xb] = '\0';
            target[0xc] = '\0';
            target[0xd] = '\0';
            target[0xe] = '\0';
            target[0xf] = 0x80;
          }
          iVar6 = iVar6 + 1;
          target = target + 0x10;
        } while (count != iVar6);
      }
    }
    if (local_90.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_90.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_90.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_90.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  return;
}

Assistant:

void VectorOperations::WriteToStorage(Vector &source, idx_t count, data_ptr_t target) {
	if (count == 0) {
		return;
	}
	UnifiedVectorFormat vdata;
	source.ToUnifiedFormat(count, vdata);

	switch (source.GetType().InternalType()) {
	case PhysicalType::BOOL:
	case PhysicalType::INT8:
		CopyToStorageLoop<int8_t>(vdata, count, target);
		break;
	case PhysicalType::INT16:
		CopyToStorageLoop<int16_t>(vdata, count, target);
		break;
	case PhysicalType::INT32:
		CopyToStorageLoop<int32_t>(vdata, count, target);
		break;
	case PhysicalType::INT64:
		CopyToStorageLoop<int64_t>(vdata, count, target);
		break;
	case PhysicalType::UINT8:
		CopyToStorageLoop<uint8_t>(vdata, count, target);
		break;
	case PhysicalType::UINT16:
		CopyToStorageLoop<uint16_t>(vdata, count, target);
		break;
	case PhysicalType::UINT32:
		CopyToStorageLoop<uint32_t>(vdata, count, target);
		break;
	case PhysicalType::UINT64:
		CopyToStorageLoop<uint64_t>(vdata, count, target);
		break;
	case PhysicalType::INT128:
		CopyToStorageLoop<hugeint_t>(vdata, count, target);
		break;
	case PhysicalType::UINT128:
		CopyToStorageLoop<uhugeint_t>(vdata, count, target);
		break;
	case PhysicalType::FLOAT:
		CopyToStorageLoop<float>(vdata, count, target);
		break;
	case PhysicalType::DOUBLE:
		CopyToStorageLoop<double>(vdata, count, target);
		break;
	case PhysicalType::INTERVAL:
		CopyToStorageLoop<interval_t>(vdata, count, target);
		break;
	default:
		throw NotImplementedException("Unimplemented type for WriteToStorage");
	}
}